

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseQuotedText(WastParser *this,string *text)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  bVar2;
  char *s;
  size_t s_length;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RCX;
  string_view sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f8;
  _anonymous_namespace_ *local_c0;
  char *local_b8;
  undefined1 local_b0 [8];
  Token token;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  iterator local_48;
  size_type local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  string *local_20;
  string *text_local;
  WastParser *this_local;
  
  local_20 = text;
  text_local = (string *)this;
  bVar1 = PeekMatch(this,Text);
  if (bVar1) {
    Consume((Token *)local_b0,this);
    sVar3 = Token::text((Token *)local_b0);
    bVar2 = std::back_inserter<std::__cxx11::string>(local_20);
    local_c0 = (_anonymous_namespace_ *)sVar3.data_;
    local_b8 = (char *)sVar3.size_;
    sVar3.size_ = (size_type)bVar2.container;
    sVar3.data_ = local_b8;
    (anonymous_namespace)::RemoveEscapes<std::back_insert_iterator<std::__cxx11::string>>
              (local_c0,sVar3,in_RCX);
    s = (char *)std::__cxx11::string::data();
    s_length = std::__cxx11::string::length();
    bVar1 = IsValidUtf8(s,s_length);
    if (!bVar1) {
      Error(this,0x4eb220);
    }
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_68,"a quoted string",
               (allocator *)((long)&token.field_2.literal_.text.size_ + 7));
    local_48 = &local_68;
    local_40 = 1;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((long)&token.field_2.literal_.text.size_ + 6));
    __l._M_len = local_40;
    __l._M_array = local_48;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_38,__l,(allocator_type *)((long)&token.field_2.literal_.text.size_ + 6));
    this_local._4_4_ = ErrorExpected(this,&local_38,"\"foo\"");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_38);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&token.field_2.literal_.text.size_ + 6));
    local_f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48;
    do {
      local_f8 = local_f8 + -1;
      std::__cxx11::string::~string((string *)local_f8);
    } while (local_f8 != &local_68);
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)&token.field_2.literal_.text.size_ + 7));
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseQuotedText(std::string* text) {
  WABT_TRACE(ParseQuotedText);
  if (!PeekMatch(TokenType::Text)) {
    return ErrorExpected({"a quoted string"}, "\"foo\"");
  }

  Token token = Consume();
  RemoveEscapes(token.text(), std::back_inserter(*text));
  if (!IsValidUtf8(text->data(), text->length())) {
    Error(token.loc, "quoted string has an invalid utf-8 encoding");
  }
  return Result::Ok;
}